

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen.c
# Opt level: O1

CURLcode Curl_fopen(Curl_easy *data,char *filename,FILE **fh,char **tempname)

{
  int iVar1;
  CURLcode CVar2;
  FILE *pFVar3;
  size_t len;
  char *pcVar4;
  char *__file;
  int __fd;
  dynbuf out;
  uchar randbuf [41];
  stat sb;
  dynbuf local_118;
  uchar local_f8 [56];
  stat64 local_c0;
  
  *tempname = (char *)0x0;
  pFVar3 = fopen64(filename,"w");
  *fh = (FILE *)pFVar3;
  __fd = -1;
  if (pFVar3 == (FILE *)0x0) {
    __file = (char *)0x0;
LAB_0012702d:
    CVar2 = CURLE_WRITE_ERROR;
  }
  else {
    iVar1 = fileno(pFVar3);
    iVar1 = fstat64(iVar1,&local_c0);
    if (iVar1 == -1) {
      return CURLE_OK;
    }
    if ((local_c0.st_mode & 0xf000) != 0x8000) {
      return CURLE_OK;
    }
    fclose((FILE *)*fh);
    *fh = (FILE *)0x0;
    CVar2 = Curl_rand_alnum(data,local_f8,0x29);
    if (CVar2 == CURLE_OK) {
      Curl_dyn_init(&local_118,8000000);
      len = strlen(filename);
      if (len != 0) {
        do {
          if (filename[len - 1] == '/') goto joined_r0x0012709a;
          len = len - 1;
        } while (len != 0);
        len = 0;
joined_r0x0012709a:
        do {
          if (len == 0) break;
          if (filename[len - 1] != '/') goto LAB_001270ac;
          len = len - 1;
        } while( true );
      }
      len = 0;
LAB_001270ac:
      CVar2 = Curl_dyn_addn(&local_118,filename,len);
      if ((CVar2 == CURLE_OK) &&
         ((len == 0 || (CVar2 = Curl_dyn_addn(&local_118,"/",1), CVar2 == CURLE_OK)))) {
        pcVar4 = Curl_dyn_ptr(&local_118);
      }
      else {
        pcVar4 = (char *)0x0;
      }
      if (pcVar4 == (char *)0x0) {
        __file = (char *)0x0;
      }
      else {
        __file = curl_maprintf("%s%s.tmp",pcVar4,local_f8);
        (*Curl_cfree)(pcVar4);
      }
      if (__file != (char *)0x0) {
        iVar1 = open64(__file,0xc1,(ulong)(local_c0.st_mode | 0x180));
        if (iVar1 != -1) {
          pFVar3 = fdopen(iVar1,"w");
          *fh = (FILE *)pFVar3;
          if (pFVar3 != (FILE *)0x0) {
            *tempname = __file;
            return CURLE_OK;
          }
          CVar2 = CURLE_WRITE_ERROR;
          __fd = iVar1;
          goto LAB_00127033;
        }
        goto LAB_0012702d;
      }
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
    __file = (char *)0x0;
  }
LAB_00127033:
  if (__fd != -1) {
    close(__fd);
    unlink(__file);
  }
  (*Curl_cfree)(__file);
  return CVar2;
}

Assistant:

CURLcode Curl_fopen(struct Curl_easy *data, const char *filename,
                    FILE **fh, char **tempname)
{
  CURLcode result = CURLE_WRITE_ERROR;
  unsigned char randbuf[41];
  char *tempstore = NULL;
  struct_stat sb;
  int fd = -1;
  char *dir = NULL;
  *tempname = NULL;

  *fh = fopen(filename, FOPEN_WRITETEXT);
  if(!*fh)
    goto fail;
  if(fstat(fileno(*fh), &sb) == -1 || !S_ISREG(sb.st_mode)) {
    return CURLE_OK;
  }
  fclose(*fh);
  *fh = NULL;

  result = Curl_rand_alnum(data, randbuf, sizeof(randbuf));
  if(result)
    goto fail;

  dir = dirslash(filename);
  if(dir) {
    /* The temp filename should not end up too long for the target file
       system */
    tempstore = aprintf("%s%s.tmp", dir, randbuf);
    free(dir);
  }

  if(!tempstore) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = CURLE_WRITE_ERROR;
#if (defined(ANDROID) || defined(__ANDROID__)) && \
    (defined(__i386__) || defined(__arm__))
  fd = open(tempstore, O_WRONLY | O_CREAT | O_EXCL, (mode_t)(0600|sb.st_mode));
#else
  fd = open(tempstore, O_WRONLY | O_CREAT | O_EXCL, 0600|sb.st_mode);
#endif
  if(fd == -1)
    goto fail;

  *fh = fdopen(fd, FOPEN_WRITETEXT);
  if(!*fh)
    goto fail;

  *tempname = tempstore;
  return CURLE_OK;

fail:
  if(fd != -1) {
    close(fd);
    unlink(tempstore);
  }

  free(tempstore);
  return result;
}